

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_program_info_log.h
# Opt level: O0

bool print_program_info_log(GLuint obj)

{
  char *pcVar1;
  ostream *poVar2;
  ulong uVar3;
  ostringstream local_3d8 [376];
  string local_260 [39];
  allocator local_239;
  string local_238 [32];
  ostringstream local_218 [376];
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [8];
  string log;
  char *infoLog;
  GLint charsWritten;
  GLint infologLength;
  GLuint obj_local;
  
  infoLog._4_4_ = 0;
  infoLog._0_4_ = 0;
  charsWritten = obj;
  (*glad_glGetProgramiv)(obj,0x8b84,(GLint *)((long)&infoLog + 4));
  if (infoLog._4_4_ < 1) {
    infologLength._3_1_ = 0;
  }
  else {
    uVar3 = (ulong)infoLog._4_4_;
    if ((long)uVar3 < 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pcVar1 = (char *)operator_new__(uVar3);
    (*glad_glGetProgramInfoLog)(charsWritten,infoLog._4_4_,(GLsizei *)&infoLog,pcVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,pcVar1,&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"ERROR",&local_79);
    std::__cxx11::ostringstream::ostringstream(local_218);
    poVar2 = (ostream *)std::ostream::flush();
    poVar2 = std::operator<<(poVar2,"\x1b[1m\x1b[31m");
    poVar2 = std::operator<<(poVar2,"ERROR");
    std::operator<<(poVar2,"\x1b[m");
    std::__cxx11::ostringstream::str();
    find_and_replace_all((string *)local_78,local_a0,(string *)local_40);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::ostringstream::~ostringstream(local_218);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"WARNING",&local_239);
    std::__cxx11::ostringstream::ostringstream(local_3d8);
    poVar2 = (ostream *)std::ostream::flush();
    poVar2 = std::operator<<(poVar2,"\x1b[1m\x1b[33m");
    poVar2 = std::operator<<(poVar2,"WARNING");
    std::operator<<(poVar2,"\x1b[m");
    std::__cxx11::ostringstream::str();
    find_and_replace_all((string *)local_238,local_260,(string *)local_40);
    std::__cxx11::string::~string((string *)local_260);
    std::__cxx11::ostringstream::~ostringstream(local_3d8);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    poVar2 = std::operator<<((ostream *)&std::cerr,local_40);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if (pcVar1 != (char *)0x0) {
      operator_delete__(pcVar1);
    }
    infologLength._3_1_ = 1;
    std::__cxx11::string::~string(local_40);
  }
  return (bool)(infologLength._3_1_ & 1);
}

Assistant:

bool print_program_info_log(const GLuint obj)
{
  GLint infologLength = 0;
  GLint charsWritten  = 0;
  
  glGetProgramiv(obj, GL_INFO_LOG_LENGTH,&infologLength);
  
  if (infologLength > 0)
  {
    char * infoLog = new char[infologLength];
    glGetProgramInfoLog(obj, infologLength, &charsWritten, infoLog);
    std::string log(infoLog);
    find_and_replace_all("ERROR",STR(REDRUM("ERROR")),log);
    find_and_replace_all("WARNING",STR(YELLOWRUM("WARNING")),log);
    std::cerr<<log<<std::endl;
    delete[] infoLog;
    return true;
  }
  return false;
}